

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void collect_mv_stats_tile(MV_STATS *mv_stats,AV1_COMP *cpi,TileInfo *tile_info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *in_RDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  MV_STATS *unaff_retaddr;
  int mi_col;
  int mi_row;
  BLOCK_SIZE sb_size;
  int sb_size_mi;
  int mi_col_end;
  int mi_col_start;
  int mi_row_end;
  int mi_row_start;
  AV1_COMMON *cm;
  int local_40;
  int local_3c;
  
  iVar1 = in_RDX[1];
  iVar2 = in_RDX[2];
  iVar3 = in_RDX[3];
  iVar4 = *(int *)(*(long *)(in_RSI + 0x42008) + 0x20);
  for (local_3c = *in_RDX; local_40 = iVar2, local_3c < iVar1; local_3c = iVar4 + local_3c) {
    for (; local_40 < iVar3; local_40 = iVar4 + local_40) {
      collect_mv_stats_sb(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                          (BLOCK_SIZE)((ulong)in_RDX >> 0x38));
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_tile(MV_STATS *mv_stats,
                                         const AV1_COMP *cpi,
                                         const TileInfo *tile_info) {
  const AV1_COMMON *cm = &cpi->common;
  const int mi_row_start = tile_info->mi_row_start;
  const int mi_row_end = tile_info->mi_row_end;
  const int mi_col_start = tile_info->mi_col_start;
  const int mi_col_end = tile_info->mi_col_end;
  const int sb_size_mi = cm->seq_params->mib_size;
  BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  for (int mi_row = mi_row_start; mi_row < mi_row_end; mi_row += sb_size_mi) {
    for (int mi_col = mi_col_start; mi_col < mi_col_end; mi_col += sb_size_mi) {
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col, sb_size);
    }
  }
}